

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O3

double fuseOrientations(double *orientations,double *weights,int size)

{
  double *list;
  ulong uVar1;
  int size_00;
  int iVar2;
  size_t __size;
  double dVar3;
  
  list = (double *)malloc(8);
  if (size < 1) {
    size_00 = 0;
  }
  else {
    uVar1 = 0;
    size_00 = 0;
    do {
      dVar3 = round(weights[uVar1] * 1000.0);
      if (0 < (int)dVar3) {
        __size = (long)size_00 * 8 + 0x10;
        iVar2 = 0;
        do {
          *(double *)((long)list + (__size - 0x10)) = orientations[uVar1];
          list = (double *)realloc(list,__size);
          __size = __size + 8;
          iVar2 = iVar2 + -1;
        } while (-(int)dVar3 != iVar2);
        size_00 = size_00 - iVar2;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)size);
  }
  dVar3 = calculateAngle325(list,size_00);
  return dVar3;
}

Assistant:

double fuseOrientations(double orientations[], double weights[],int size){
    int count = 0;
    double* list = (double*)malloc(sizeof(double));
    for (int i = 0; i < size; i++) {
        int num = round(weights[i] * 1000);
        for(int j = 0;j < num;j++){
            list[count++] = orientations[i];
            list = realloc(list, sizeof(double) * (count + 1));
        }
    }
    return calculateAngle325(list,count);
}